

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int str_utf8_forward(char *str,int cursor)

{
  char *pcVar1;
  char *buf;
  int cursor_local;
  char *str_local;
  int local_4;
  
  pcVar1 = str + cursor;
  local_4 = cursor;
  if (*pcVar1 != '\0') {
    if (((int)*pcVar1 & 0x80U) == 0) {
      local_4 = cursor + 1;
    }
    else if (((int)*pcVar1 & 0xe0U) == 0xc0) {
      if (pcVar1[1] == '\0') {
        local_4 = cursor + 1;
      }
      else {
        local_4 = cursor + 2;
      }
    }
    else if (((int)*pcVar1 & 0xf0U) == 0xe0) {
      if (pcVar1[1] == '\0') {
        local_4 = cursor + 1;
      }
      else if (pcVar1[2] == '\0') {
        local_4 = cursor + 2;
      }
      else {
        local_4 = cursor + 3;
      }
    }
    else if (((int)*pcVar1 & 0xf8U) == 0xf0) {
      if (pcVar1[1] == '\0') {
        local_4 = cursor + 1;
      }
      else if (pcVar1[2] == '\0') {
        local_4 = cursor + 2;
      }
      else if (pcVar1[3] == '\0') {
        local_4 = cursor + 3;
      }
      else {
        local_4 = cursor + 4;
      }
    }
    else {
      local_4 = cursor + 1;
    }
  }
  return local_4;
}

Assistant:

int str_utf8_forward(const char *str, int cursor)
{
	const char *buf = str + cursor;
	if(!buf[0])
		return cursor;

	if((*buf&0x80) == 0x0)  /* 0xxxxxxx */
		return cursor+1;
	else if((*buf&0xE0) == 0xC0) /* 110xxxxx */
	{
		if(!buf[1]) return cursor+1;
		return cursor+2;
	}
	else  if((*buf & 0xF0) == 0xE0)	/* 1110xxxx */
	{
		if(!buf[1]) return cursor+1;
		if(!buf[2]) return cursor+2;
		return cursor+3;
	}
	else if((*buf & 0xF8) == 0xF0)	/* 11110xxx */
	{
		if(!buf[1]) return cursor+1;
		if(!buf[2]) return cursor+2;
		if(!buf[3]) return cursor+3;
		return cursor+4;
	}

	/* invalid */
	return cursor+1;
}